

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O3

bool __thiscall Timidity::GF1Envelope::Update(GF1Envelope *this,Voice *v)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = this->target;
  iVar2 = this->increment;
  iVar3 = this->volume + iVar2;
  this->volume = iVar3;
  if ((iVar3 <= iVar1 && iVar2 < 0) || (iVar1 <= iVar3 && 0 < iVar2)) {
    this->volume = iVar1;
    Recompute(this,v);
  }
  return false;
}

Assistant:

bool GF1Envelope::Update(Voice *v)
{
	volume += increment;
	if (((increment < 0) && (volume <= target)) || ((increment > 0) && (volume >= target)))
	{
		volume = target;
		if (Recompute(v))
		{
			return 1;
		}
	}
	return 0;
}